

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O2

void __thiscall trieste::detail::Make::error(Make *this,string *msg,size_t index)

{
  Location *pLVar1;
  element_type *this_00;
  undefined1 auStack_58 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38 [3];
  
  this_00 = (this->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((this_00->type_).def != (TokenDef *)Group) {
    auStack_58._16_8_ = Group;
    push(this,(Token *)(auStack_58 + 0x10),0);
    this_00 = (this->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  pLVar1 = REMatch::at(&this->re_match,index);
  Location::Location((Location *)(auStack_58 + 0x18),pLVar1);
  make_error((Make *)auStack_58,(Location *)this,(string *)(auStack_58 + 0x18));
  NodeDef::push_back(this_00,(Node *)auStack_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_38);
  return;
}

Assistant:

void error(const std::string& msg, size_t index = 0)
      {
        if (!in(Group))
          push(Group);

        node->push_back(make_error(re_match.at(index), msg));
      }